

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uidgid.c
# Opt level: O2

uint uidgids_set(uidgid *u,char *ug)

{
  uint uVar1;
  uint uVar2;
  unsigned_long in_RAX;
  int iVar3;
  char *s;
  long lVar4;
  char *pcVar5;
  unsigned_long id;
  
  id = in_RAX;
  uVar1 = scan_ulong(ug,&id);
  uVar2 = 0;
  if (ug[uVar1] == ':') {
    pcVar5 = ug + uVar1;
    u->uid = (uid_t)id;
    iVar3 = 0x3c;
    for (lVar4 = 1; s = pcVar5 + 1, lVar4 != 0x3d; lVar4 = lVar4 + 1) {
      uVar2 = scan_ulong(s,&id);
      pcVar5 = s + uVar2;
      u->gid[lVar4 + -1] = (uid_t)id;
      if (s[uVar2] != ':') {
        iVar3 = (int)lVar4;
        s = pcVar5;
        break;
      }
    }
    u->gid[iVar3] = 0;
    u->gids = iVar3;
    uVar2 = (uint)(*s == '\0');
  }
  return uVar2;
}

Assistant:

unsigned int uidgids_set(struct uidgid *u, char *ug) {
  unsigned long id;
  int i;

  if (*(ug +=scan_ulong(ug, &id)) != ':') return(0);
  u->uid =(uid_t)id;
  ++ug;
  for (i =0; i < 60; ++i, ++ug) {
    ug +=scan_ulong(ug, &id);
    u->gid[i] =(gid_t)id;
    if (*ug != ':') { ++i; break; }
  }
  u->gid[i] =0;
  u->gids =i;
  if (*ug) return(0);
  return(1);
}